

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O2

void __thiscall OpenMD::SequentialAnalyzer::doSequence(SequentialAnalyzer *this)

{
  Snapshot *this_00;
  int iVar1;
  int whichFrame;
  DumpReader reader;
  SelectionSet local_12a0;
  DumpReader local_1288;
  
  (*this->_vptr_SequentialAnalyzer[3])();
  DumpReader::DumpReader(&local_1288,this->info_,&this->dumpFilename_);
  iVar1 = DumpReader::getNFrames(&local_1288);
  whichFrame = 0;
  while( true ) {
    this->frame_ = whichFrame;
    if (iVar1 <= whichFrame) break;
    DumpReader::readFrame(&local_1288,whichFrame);
    this_00 = this->info_->sman_->currentSnapshot_;
    this->currentSnapshot_ = this_00;
    local_12a0.bitsets_.
    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)Snapshot::getTime(this_00);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (&this->times_,(double *)&local_12a0);
    if ((this->evaluator1_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12a0,&this->evaluator1_);
      SelectionManager::setSelectionSet(&this->seleMan1_,&local_12a0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12a0.bitsets_);
    }
    if ((this->evaluator2_).isDynamic_ == true) {
      SelectionEvaluator::evaluate(&local_12a0,&this->evaluator2_);
      SelectionManager::setSelectionSet(&this->seleMan2_,&local_12a0);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                (&local_12a0.bitsets_);
    }
    (*this->_vptr_SequentialAnalyzer[6])(this,(ulong)(uint)this->frame_);
    whichFrame = this->frame_ + this->step_;
  }
  (*this->_vptr_SequentialAnalyzer[4])(this);
  (*this->_vptr_SequentialAnalyzer[5])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void SequentialAnalyzer::doSequence() {
    preSequence();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    // storageLayout_ = info_->getStorageLayout();

    for (frame_ = 0; frame_ < nFrames; frame_ += step_) {
      reader.readFrame(frame_);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      times_.push_back(currentSnapshot_->getTime());

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      doFrame(frame_);
    }

    postSequence();
    writeSequence();
  }